

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreGCR.cpp
# Opt level: O0

void Storage::Encodings::CommodoreGCR::encode_block(uint8_t *destination,uint8_t *source)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint encoded_bytes [4];
  uint8_t *source_local;
  uint8_t *destination_local;
  
  uVar1 = encoding_for_byte(*source);
  uVar2 = encoding_for_byte(source[1]);
  uVar3 = encoding_for_byte(source[2]);
  uVar4 = encoding_for_byte(source[3]);
  *destination = (uint8_t)(uVar1 >> 2);
  destination[1] = (byte)(uVar1 << 6) | (byte)(uVar2 >> 4);
  destination[2] = (byte)(uVar2 << 4) | (byte)(uVar3 >> 6);
  destination[3] = (byte)(uVar3 << 2) | (byte)(uVar4 >> 8);
  destination[4] = (uint8_t)uVar4;
  return;
}

Assistant:

void Storage::Encodings::CommodoreGCR::encode_block(uint8_t *destination, uint8_t *source) {
	unsigned int encoded_bytes[4] = {
		encoding_for_byte(source[0]),
		encoding_for_byte(source[1]),
		encoding_for_byte(source[2]),
		encoding_for_byte(source[3]),
	};

	destination[0] = uint8_t(encoded_bytes[0] >> 2);
	destination[1] = uint8_t((encoded_bytes[0] << 6) | (encoded_bytes[1] >> 4));
	destination[2] = uint8_t((encoded_bytes[1] << 4) | (encoded_bytes[2] >> 6));
	destination[3] = uint8_t((encoded_bytes[2] << 2) | (encoded_bytes[3] >> 8));
	destination[4] = uint8_t(encoded_bytes[3]);
}